

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Driver.cpp
# Opt level: O3

void __thiscall slang::driver::Driver::printWarning(Driver *this,string *message)

{
  string_view text;
  string_view text_00;
  string_view text_01;
  text_style local_20;
  
  local_20.foreground_color =
       (color_type)
       ((ulong)(byte)(((this->textDiagClient).
                       super___shared_ptr<slang::TextDiagnosticClient,_(__gnu_cxx::_Lock_policy)2>.
                      _M_ptr)->super_DiagnosticClient).field_0x1a << 0x20);
  local_20.background_color.is_rgb = false;
  local_20.background_color.value.term_color = '\0';
  local_20.ems = ~(strikethrough|conceal|reverse|blink|underline|italic|faint|bold);
  local_20.set_foreground_color = true;
  local_20.set_background_color = false;
  text._M_str = "warning: ";
  text._M_len = 9;
  OS::printE(&local_20,text);
  text_00._M_str = (message->_M_dataplus)._M_p;
  text_00._M_len = message->_M_string_length;
  OS::printE(text_00);
  text_01._M_str = "\n";
  text_01._M_len = 1;
  OS::printE(text_01);
  return;
}

Assistant:

void Driver::printWarning(const std::string& message) {
    OS::printE(fg(textDiagClient->warningColor), "warning: ");
    OS::printE(message);
    OS::printE("\n");
}